

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-stb-image.h
# Opt level: O1

void * stbi__pnm_load(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri)

{
  stbi__uint32 c_00;
  int *piVar1;
  stbi_uc sVar2;
  stbi_uc sVar3;
  stbi__uint32 sVar4;
  int iVar5;
  int iVar6;
  undefined8 in_RAX;
  stbi__uint16 *psVar7;
  char *pcVar8;
  uchar *puVar9;
  undefined4 in_register_00000084;
  int iVar10;
  long in_FS_OFFSET;
  char c;
  undefined8 uStack_38;
  
  piVar1 = (int *)CONCAT44(in_register_00000084,req_comp);
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  uStack_38 = in_RAX;
  sVar2 = stbi__get8(s);
  sVar3 = stbi__get8(s);
  if ((byte)(sVar3 - 0x37) < 0xfe || sVar2 != 'P') {
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
LAB_00134309:
    iVar6 = 0;
  }
  else {
    s->img_n = (uint)(sVar3 == '6') * 2 + 1;
    sVar2 = stbi__get8(s);
    uStack_38._0_4_ = CONCAT13(sVar2,(undefined3)uStack_38);
    stbi__pnm_skip_whitespace(s,(char *)((long)&uStack_38 + 3));
    sVar4 = stbi__pnm_getinteger(s,(char *)((long)&uStack_38 + 3));
    if (s != (stbi__context *)0x0) {
      s->img_x = sVar4;
    }
    if (sVar4 == 0) {
LAB_001342f9:
      pcVar8 = "invalid width";
LAB_00134300:
      *(char **)(in_FS_OFFSET + -8) = pcVar8;
      goto LAB_00134309;
    }
    stbi__pnm_skip_whitespace(s,(char *)((long)&uStack_38 + 3));
    sVar4 = stbi__pnm_getinteger(s,(char *)((long)&uStack_38 + 3));
    s->img_y = sVar4;
    if (sVar4 == 0) goto LAB_001342f9;
    stbi__pnm_skip_whitespace(s,(char *)((long)&uStack_38 + 3));
    iVar6 = stbi__pnm_getinteger(s,(char *)((long)&uStack_38 + 3));
    if (0xffff < iVar6) {
      pcVar8 = "max value > 65535";
      goto LAB_00134300;
    }
    iVar6 = (uint)(0xff < iVar6) * 8 + 8;
  }
  *piVar1 = iVar6;
  if (iVar6 == 0) {
    return (void *)0x0;
  }
  if ((s->img_y < 0x1000001) && (s->img_x < 0x1000001)) {
    *x = s->img_x;
    *y = s->img_y;
    if (comp != (int *)0x0) {
      *comp = s->img_n;
    }
    iVar6 = s->img_n;
    sVar4 = s->img_x;
    c_00 = s->img_y;
    iVar5 = *piVar1;
    iVar10 = iVar5 + 7;
    if (-1 < iVar5) {
      iVar10 = iVar5;
    }
    iVar10 = iVar10 >> 3;
    iVar5 = stbi__mad4sizes_valid(iVar6,sVar4,c_00,iVar10,req_comp);
    if (iVar5 != 0) {
      uStack_38._4_4_ = iVar6;
      psVar7 = (stbi__uint16 *)stbi__malloc_mad4(iVar6,sVar4,c_00,iVar10,req_comp);
      if (psVar7 == (stbi__uint16 *)0x0) {
        pcVar8 = "outofmem";
      }
      else {
        iVar6 = stbi__getn(s,(stbi_uc *)psVar7,sVar4 * uStack_38._4_4_ * c_00 * iVar10);
        if (iVar6 != 0) {
          iVar6 = s->img_n;
          if (iVar6 == 4) {
            return psVar7;
          }
          if (*piVar1 == 0x10) {
            psVar7 = stbi__convert_format16(psVar7,iVar6,s->img_x,s->img_y,req_comp);
            return psVar7;
          }
          puVar9 = stbi__convert_format((uchar *)psVar7,iVar6,s->img_x,s->img_y,req_comp);
          return puVar9;
        }
        free(psVar7);
        pcVar8 = "bad PNM";
      }
      goto LAB_001343e9;
    }
  }
  pcVar8 = "too large";
LAB_001343e9:
  *(char **)(in_FS_OFFSET + -8) = pcVar8;
  return (void *)0x0;
}

Assistant:

static void *stbi__pnm_load(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri)
{
   stbi_uc *out;
   STBI_NOTUSED(ri);

   ri->bits_per_channel = stbi__pnm_info(s, (int *)&s->img_x, (int *)&s->img_y, (int *)&s->img_n);
   if (ri->bits_per_channel == 0)
      return 0;

   if (s->img_y > STBI_MAX_DIMENSIONS) return stbi__errpuc("too large","Very large image (corrupt?)");
   if (s->img_x > STBI_MAX_DIMENSIONS) return stbi__errpuc("too large","Very large image (corrupt?)");

   *x = s->img_x;
   *y = s->img_y;
   if (comp) *comp = s->img_n;

   if (!stbi__mad4sizes_valid(s->img_n, s->img_x, s->img_y, ri->bits_per_channel / 8, 0))
      return stbi__errpuc("too large", "PNM too large");

   out = (stbi_uc *) stbi__malloc_mad4(s->img_n, s->img_x, s->img_y, ri->bits_per_channel / 8, 0);
   if (!out) return stbi__errpuc("outofmem", "Out of memory");
   if (!stbi__getn(s, out, s->img_n * s->img_x * s->img_y * (ri->bits_per_channel / 8))) {
      STBI_FREE(out);
      return stbi__errpuc("bad PNM", "PNM file truncated");
   }

   if (req_comp && req_comp != s->img_n) {
      if (ri->bits_per_channel == 16) {
         out = (stbi_uc *) stbi__convert_format16((stbi__uint16 *) out, s->img_n, req_comp, s->img_x, s->img_y);
      } else {
         out = stbi__convert_format(out, s->img_n, req_comp, s->img_x, s->img_y);
      }
      if (out == NULL) return out; // stbi__convert_format frees input on failure
   }
   return out;
}